

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void __thiscall spdlog::logger::logger(logger *this,string *name,sink_ptr *single_sink)

{
  sinks_init_list sinks;
  shared_ptr<spdlog::sinks::sink> local_48;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)name);
  local_48.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (single_sink->super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (single_sink->super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  (single_sink->super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (single_sink->super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  sinks._M_len = 1;
  sinks._M_array = &local_48;
  logger(this,&local_38,sinks);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

logger(std::string name, sink_ptr single_sink)
        : logger(std::move(name), {std::move(single_sink)}) {}